

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O3

pair<std::complex<double>,_std::complex<double>_> *
Utils::SolveQuadratic
          (pair<std::complex<double>,_std::complex<double>_> *__return_storage_ptr__,double a,
          double b,double c)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  
  dVar4 = 0.0;
  dVar1 = csqrt(b * b + a * -4.0 * c);
  dVar7 = a + a;
  auVar5._8_8_ = dVar4 + 0.0;
  auVar5._0_8_ = dVar1 - b;
  auVar2._8_8_ = dVar7;
  auVar2._0_8_ = dVar7;
  auVar6 = divpd(auVar5,auVar2);
  *(undefined1 (*) [16])(__return_storage_ptr__->first)._M_value = auVar6;
  auVar3._0_8_ = -b - dVar1;
  auVar3._8_8_ = 0.0 - dVar4;
  auVar6._8_8_ = dVar7;
  auVar6._0_8_ = dVar7;
  auVar6 = divpd(auVar3,auVar6);
  *(undefined1 (*) [16])(__return_storage_ptr__->second)._M_value = auVar6;
  return __return_storage_ptr__;
}

Assistant:

std::pair<Complex, Complex> Utils::SolveQuadratic(double a, double b, double c)
{
    Complex D = std::sqrt(Complex(b * b - 4 * a * c));
    return {(Complex(-b) + D) / (2 * a), (Complex(-b) - D) / (2 * a)};
}